

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viface.cpp
# Opt level: O0

VIfaceImpl * __thiscall
viface::VIfaceImpl::ioctlGetIPv4_abi_cxx11_(VIfaceImpl *this,unsigned_long request)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  runtime_error *prVar5;
  ulong in_RDX;
  allocator local_252;
  undefined1 local_251;
  string local_250 [32];
  undefined1 *local_230;
  sockaddr_in *ipaddr;
  char addr [16];
  string local_210 [48];
  string local_1e0 [32];
  undefined1 local_1c0 [8];
  ifreq ifr;
  ostringstream what;
  unsigned_long request_local;
  VIfaceImpl *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(ifr.ifr_ifru.ifru_slave + 0x10));
  iVar1 = *(int *)(request + 8);
  std::__cxx11::string::string(local_1e0,(string *)(request + 0x28));
  read_flags(iVar1,(string *)local_1e0,(ifreq *)local_1c0);
  std::__cxx11::string::~string(local_1e0);
  iVar1 = ioctl(*(int *)(request + 8),in_RDX,local_1c0);
  if (iVar1 != 0) {
    poVar2 = std::operator<<((ostream *)(ifr.ifr_ifru.ifru_slave + 0x10),
                             "--- Unable to get IPv4 for ");
    poVar2 = std::operator<<(poVar2,(string *)(request + 0x28));
    poVar2 = std::operator<<(poVar2,".");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)(ifr.ifr_ifru.ifru_slave + 0x10),"    Error: ");
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::operator<<(poVar2,pcVar4);
    poVar2 = std::operator<<((ostream *)(ifr.ifr_ifru.ifru_slave + 0x10)," (");
    piVar3 = __errno_location();
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*piVar3);
    poVar2 = std::operator<<(poVar2,").");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    addr[0xf] = '\x01';
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_210);
    addr[0xf] = '\0';
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  memset(&ipaddr,0,0x10);
  local_230 = (undefined1 *)((long)&ifr.ifr_ifrn + 8);
  pcVar4 = inet_ntop(2,(void *)((long)&ifr.ifr_ifrn + 0xc),(char *)&ipaddr,0x10);
  if (pcVar4 == (char *)0x0) {
    poVar2 = std::operator<<((ostream *)(ifr.ifr_ifru.ifru_slave + 0x10),
                             "--- Unable to convert IPv4 for ");
    poVar2 = std::operator<<(poVar2,(string *)(request + 0x28));
    poVar2 = std::operator<<(poVar2,".");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)(ifr.ifr_ifru.ifru_slave + 0x10),"    Error: ");
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::operator<<(poVar2,pcVar4);
    poVar2 = std::operator<<((ostream *)(ifr.ifr_ifru.ifru_slave + 0x10)," (");
    piVar3 = __errno_location();
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*piVar3);
    poVar2 = std::operator<<(poVar2,").");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_251 = 1;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_250);
    local_251 = 0;
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,(char *)&ipaddr,&local_252);
  std::allocator<char>::~allocator((allocator<char> *)&local_252);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(ifr.ifr_ifru.ifru_slave + 0x10));
  return this;
}

Assistant:

string VIfaceImpl::ioctlGetIPv4(unsigned long request) const
{
    ostringstream what;

    // Read interface flags
    struct ifreq ifr;
    read_flags(this->kernel_socket, this->name, ifr);

    if (ioctl(this->kernel_socket, request, &ifr) != 0) {
        what << "--- Unable to get IPv4 for " << this->name << "." << endl;
        what << "    Error: " << strerror(errno);
        what << " (" << errno << ")." << endl;
        throw runtime_error(what.str());
    }

    // Convert binary IP address to string
    char addr[INET_ADDRSTRLEN];
    memset(&addr, 0, sizeof(addr));

    struct sockaddr_in* ipaddr = (struct sockaddr_in*) &ifr.ifr_addr;
    if (inet_ntop(AF_INET, &(ipaddr->sin_addr), addr, sizeof(addr)) == NULL) {
        what << "--- Unable to convert IPv4 for " << this->name << "." << endl;
        what << "    Error: " << strerror(errno);
        what << " (" << errno << ")." << endl;
        throw runtime_error(what.str());
    }

    return string(addr);
}